

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimMv.c
# Opt level: O3

Vec_Int_t * Saig_MvManFindOscilators(Saig_MvMan_t *p,Vec_Int_t **pvConst0)

{
  int iFlop;
  int iVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  long lVar4;
  Vec_Int_t *vBinary;
  Vec_Int_t *local_30;
  
  pVVar2 = Saig_MvManFindConstBinaryFlops(p,&local_30);
  *pvConst0 = pVVar2;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  piVar3 = (int *)malloc(400);
  pVVar2->pArray = piVar3;
  if (0 < local_30->nSize) {
    lVar4 = 0;
    do {
      iFlop = local_30->pArray[lVar4];
      iVar1 = Saig_MvManCheckOscilator(p,iFlop);
      if (iVar1 != 0) {
        Vec_IntPush(pVVar2,iFlop);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < local_30->nSize);
  }
  if (local_30->pArray != (int *)0x0) {
    free(local_30->pArray);
  }
  free(local_30);
  return pVVar2;
}

Assistant:

Vec_Int_t * Saig_MvManFindOscilators( Saig_MvMan_t * p, Vec_Int_t ** pvConst0 )
{
    Vec_Int_t * vBinary, * vOscils;
    int Entry, i;
    // detect constant flops
    *pvConst0 = Saig_MvManFindConstBinaryFlops( p, &vBinary );
    // check binary flops
    vOscils = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vBinary, Entry, i )
        if ( Saig_MvManCheckOscilator( p, Entry ) )
            Vec_IntPush( vOscils, Entry );
    Vec_IntFree( vBinary );
    return vOscils;
}